

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_RDI;
  int i;
  void **elements;
  int n;
  undefined4 local_6c;
  
  iVar1 = *(int *)(in_RDI + 8);
  if (0 < iVar1) {
    lVar2 = *(long *)(in_RDI + 0x10);
    local_6c = 0;
    do {
      iVar3 = local_6c + 1;
      cast<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                (*(void **)(lVar2 + 8 + (long)local_6c * 8));
      GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>::Clear
                ((DescriptorProto_ReservedRange *)0x53bd3b);
      local_6c = iVar3;
    } while (iVar3 < iVar1);
    *(undefined4 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}